

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

const_iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::find
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  bool bVar1;
  less<int> local_2b [2];
  less<int> local_29;
  node *local_28;
  node *node;
  key_type *k_local;
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this_local;
  
  node = (node *)k;
  k_local = (key_type *)this;
  this_local = (mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
               __return_storage_ptr__;
  local_28 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             ::root(&this->
                     super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                   );
  while( true ) {
    bVar1 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ::validNode(&this->
                         super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                        ,local_28);
    if (!bVar1) {
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::end(__return_storage_ptr__,
            &this->
             super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           );
      return __return_storage_ptr__;
    }
    bVar1 = equal(this,(key_type *)local_28,(key_type *)node);
    if (bVar1) break;
    key_comp(this);
    bVar1 = less<int>::operator()(&local_29,(int *)local_28,(int *)node);
    if (bVar1) {
      local_28 = local_28->right;
    }
    else {
      key_comp(this);
      bVar1 = less<int>::operator()(local_2b,(int *)node,(int *)local_28);
      if (bVar1) {
        local_28 = local_28->left;
      }
    }
  }
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ::constTreeIterator(__return_storage_ptr__,
                      &(this->
                       super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                       ).m_tree,local_28);
  return __return_storage_ptr__;
}

Assistant:

const_iterator	find(key_type const & k) const
	{
		node*	node = this->root();
		while (this->validNode(node))
		{
			if (this->equal(node->value.first, k)) return const_iterator(this->m_tree, node);
			else if (this->key_comp()(node->value.first, k)) node = node->right;
			else if (this->key_comp()(k, node->value.first)) node = node->left;
		}
		return this->end();
	}